

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::InternalMergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  int iVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  reference pvVar3;
  reference other_00;
  int local_20;
  int i;
  int other_field_count;
  UnknownFieldSet *other_local;
  UnknownFieldSet *this_local;
  
  iVar1 = field_count(other);
  if (0 < iVar1) {
    pvVar2 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)operator_new(0x18);
    memset(pvVar2,0,0x18);
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    vector(pvVar2);
    this->fields_ = pvVar2;
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      pvVar2 = this->fields_;
      pvVar3 = std::
               vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ::operator[](other->fields_,(long)local_20);
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      push_back(pvVar2,pvVar3);
      pvVar3 = std::
               vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ::back(this->fields_);
      other_00 = std::
                 vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ::operator[](other->fields_,(long)local_20);
      UnknownField::DeepCopy(pvVar3,other_00);
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::InternalMergeFrom(const UnknownFieldSet& other) {
  int other_field_count = other.field_count();
  if (other_field_count > 0) {
    fields_ = new std::vector<UnknownField>();
    for (int i = 0; i < other_field_count; i++) {
      fields_->push_back((*other.fields_)[i]);
      fields_->back().DeepCopy((*other.fields_)[i]);
    }
  }
}